

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long *plVar1;
  long row;
  double dVar2;
  byte bVar3;
  REAL RVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  MElementType MVar10;
  uint uVar11;
  long lVar12;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar13;
  double *pdVar14;
  int iVar15;
  ulong uVar16;
  int c;
  ulong uVar17;
  int d;
  REAL detjac;
  int order;
  ulong local_958;
  ulong local_950;
  TPZFMatrix<double> *local_948;
  long local_940;
  long local_938;
  ulong local_930;
  TPZGeoElSide gelside;
  TPZManVector<int,_9> permutegather;
  TPZManVector<long,_8> id;
  TPZManVector<int,_9> ord;
  TPZManVector<long,_28> FirstIndex;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<50,_double> dphiloc;
  TPZFNMatrix<50,_double> philoc;
  
  local_948 = phi;
  if ((side != 9) && (point->fNElements == 1)) {
    iVar5 = pztopology::TPZQuadrilateral::SideDimension(side);
    if (iVar5 == 1) {
      iVar6 = pztopology::TPZQuadrilateral::NContainedSides(side);
      c = 0;
      uVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x250))(this,0,side);
      lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,uVar7);
      bVar3 = *(byte *)(lVar12 + 0x14);
      iVar5 = 0;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      iVar15 = 0;
      order = (uint)bVar3;
      for (; iVar5 != c; c = c + 1) {
        iVar8 = pztopology::TPZQuadrilateral::ContainedSideLocId(side,c);
        iVar8 = pzshape::TPZShapeQuad::NConnectShapeF(iVar8,(uint)bVar3);
        iVar15 = iVar15 + iVar8;
      }
      this_00 = TPZCompEl::Reference((TPZCompEl *)this);
      uVar9 = pztopology::TPZQuadrilateral::NSideNodes(side);
      TPZManVector<long,_8>::TPZManVector(&id,(long)(int)uVar9);
      uVar16 = 0;
      uVar17 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar17 = 0;
      }
      for (; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        iVar5 = pztopology::TPZQuadrilateral::SideNodeLocId(side,(int)uVar16);
        pTVar13 = TPZGeoEl::Node(this_00,iVar5);
        id.super_TPZVec<long>.fStore[uVar16] = (long)pTVar13->fId;
      }
      TPZManVector<int,_9>::TPZManVector(&permutegather,(long)iVar6);
      MVar10 = pztopology::TPZQuadrilateral::Type(side);
      if (MVar10 == EOned) {
        iVar5 = pztopology::TPZLine::GetTransformId(&id.super_TPZVec<long>);
        pztopology::TPZLine::GetSideHDivPermutation(iVar5,&permutegather.super_TPZVec<int>);
      }
      else if (MVar10 == ETriangle) {
        iVar5 = pztopology::TPZTriangle::GetTransformId(&id.super_TPZVec<long>);
        pztopology::TPZTriangle::GetSideHDivPermutation(iVar5,&permutegather.super_TPZVec<int>);
      }
      else {
        if (MVar10 != EQuadrilateral) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                     ,0x200);
        }
        iVar5 = pztopology::TPZQuadrilateral::GetTransformId(&id.super_TPZVec<long>);
        pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar5,&permutegather.super_TPZVec<int>)
        ;
      }
      TPZManVector<int,_9>::TPZManVector(&ord,9,&order);
      uVar9 = pztopology::TPZQuadrilateral::SideDimension(side);
      TPZFNMatrix<50,_double>::TPZFNMatrix(&philoc,(long)iVar15,1);
      TPZFNMatrix<50,_double>::TPZFNMatrix(&dphiloc,(long)(int)uVar9,(long)iVar15);
      pzshape::TPZShapeQuad::SideShape
                (side,point,&id.super_TPZVec<long>,&ord.super_TPZVec<int>,
                 &philoc.super_TPZFMatrix<double>,&dphiloc.super_TPZFMatrix<double>);
      uVar11 = pztopology::TPZQuadrilateral::NContainedSides(side);
      jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)0x0;
      TPZManVector<long,_28>::TPZManVector(&FirstIndex,(long)(int)(uVar11 + 1),(long *)&jac);
      uVar16 = 0;
      local_950 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        local_950 = uVar16;
      }
      for (; local_950 != uVar16; uVar16 = uVar16 + 1) {
        iVar5 = pztopology::TPZQuadrilateral::ContainedSideLocId(side,(int)uVar16);
        lVar12 = FirstIndex.super_TPZVec<long>.fStore[uVar16];
        iVar5 = pzshape::TPZShapeQuad::NConnectShapeF(iVar5,order);
        FirstIndex.super_TPZVec<long>.fStore[uVar16 + 1] = lVar12 + iVar5;
      }
      detjac = 1.0;
      gelside.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
      gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      gelside.fSide = side;
      iVar5 = (**(code **)(*(long *)this_00 + 0x208))(this_00,side);
      lVar12 = (long)iVar5;
      TPZFNMatrix<9,_double>::TPZFNMatrix(&jac,lVar12,lVar12);
      TPZFNMatrix<9,_double>::TPZFNMatrix(&jacinv,lVar12,lVar12);
      TPZFNMatrix<9,_double>::TPZFNMatrix(&axes,lVar12,3);
      TPZGeoElSide::Jacobian
                (&gelside,point,&jac.super_TPZFMatrix<double>,&axes.super_TPZFMatrix<double>,&detjac
                 ,&jacinv.super_TPZFMatrix<double>);
      TPZFNMatrix<9,_double>::~TPZFNMatrix(&axes);
      TPZFNMatrix<9,_double>::~TPZFNMatrix(&jacinv);
      TPZFNMatrix<9,_double>::~TPZFNMatrix(&jac);
      if (MVar10 == ETriangle) {
        detjac = detjac / 6.0;
      }
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      local_958 = 0;
      while (local_958 != local_950) {
        plVar1 = FirstIndex.super_TPZVec<long>.fStore + local_958;
        local_938 = (long)(int)FirstIndex.super_TPZVec<long>.fStore
                               [permutegather.super_TPZVec<int>.fStore[local_958]];
        lVar12 = local_958 + 1;
        local_958 = local_958 + 1;
        uVar11 = (int)FirstIndex.super_TPZVec<long>.fStore[lVar12] - (int)*plVar1;
        local_940 = (long)(int)*plVar1;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        local_930 = (ulong)uVar11;
        for (uVar16 = 0; uVar16 != local_930; uVar16 = uVar16 + 1) {
          lVar12 = uVar16 + local_938;
          pdVar14 = TPZFMatrix<double>::operator()(&philoc.super_TPZFMatrix<double>,lVar12,0);
          RVar4 = detjac;
          dVar2 = *pdVar14;
          row = uVar16 + local_940;
          pdVar14 = TPZFMatrix<double>::operator()(local_948,row,0);
          *pdVar14 = dVar2 / RVar4;
          for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
            pdVar14 = TPZFMatrix<double>::operator()
                                (&dphiloc.super_TPZFMatrix<double>,uVar17,lVar12);
            RVar4 = detjac;
            dVar2 = *pdVar14;
            pdVar14 = TPZFMatrix<double>::operator()(dphi,uVar17,row);
            *pdVar14 = dVar2 / RVar4;
          }
        }
      }
      TPZManVector<long,_28>::~TPZManVector(&FirstIndex);
      TPZFNMatrix<50,_double>::~TPZFNMatrix(&dphiloc);
      TPZFNMatrix<50,_double>::~TPZFNMatrix(&philoc);
      TPZManVector<int,_9>::~TPZManVector(&ord);
      TPZManVector<int,_9>::~TPZManVector(&permutegather);
      TPZManVector<long,_8>::~TPZManVector(&id);
    }
    return;
  }
  std::operator<<((ostream *)&std::cout,"Don\'t have side shape associated to this side");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp",
             0x1cf);
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}